

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::perturbMax(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *uvec,
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *p_low,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *p_up,
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *eps,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *p_delta,int start,int incr)

{
  fpclass_type fVar1;
  int32_t iVar2;
  Real RVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  Status SVar7;
  int iVar8;
  long lVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  pointer pnVar11;
  uint *puVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  pointer pnVar14;
  undefined4 *puVar15;
  pointer pnVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  undefined4 *puVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  uint uVar20;
  ulong uVar21;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar22;
  long in_FS_OFFSET;
  byte bVar23;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_1038 [120];
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_fc0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_fb8;
  cpp_dec_float<200U,_int,_void> *local_fb0;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_fa8;
  undefined8 uStack_fa0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f98;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f90;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f88;
  undefined8 uStack_f80;
  cpp_dec_float<200U,_int,_void> *local_f78;
  undefined8 uStack_f70;
  undefined1 local_f68 [120];
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_ef0;
  double local_ee0;
  pointer local_ed8;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_ed0;
  double local_ec8;
  undefined8 uStack_ec0;
  undefined1 local_eb8 [128];
  cpp_dec_float<200U,_int,_void> *local_e38;
  Random *local_e30;
  undefined1 local_e28 [124];
  int32_t iStack_dac;
  undefined1 local_da8 [128];
  double local_d28;
  undefined8 uStack_d20;
  cpp_dec_float<200U,_int,_void> local_d18;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined5 uStack_c30;
  undefined3 uStack_c2b;
  undefined5 uStack_c28;
  undefined8 local_c20;
  cpp_dec_float<200U,_int,_void> local_c18;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined5 uStack_b30;
  undefined3 uStack_b2b;
  undefined5 uStack_b28;
  undefined8 local_b20;
  cpp_dec_float<200U,_int,_void> local_b18;
  cpp_dec_float<200U,_int,_void> local_a98;
  cpp_dec_float<200U,_int,_void> local_a10;
  cpp_dec_float<200U,_int,_void> local_990;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_910;
  undefined1 local_890 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_810;
  undefined1 local_790 [128];
  undefined1 local_710 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_690;
  undefined1 local_610 [128];
  undefined1 local_590 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_510;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_490;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_410;
  undefined1 local_390 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_310;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_290;
  undefined1 local_210 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_190;
  undefined4 local_110 [28];
  undefined4 local_a0 [28];
  
  bVar23 = 0;
  local_ed8 = (uvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_a98.fpclass = cpp_dec_float_finite;
  local_a98.prec_elem = 0x1c;
  local_a98.data._M_elems[0] = 0;
  local_a98.data._M_elems[1] = 0;
  local_a98.data._M_elems[2] = 0;
  local_a98.data._M_elems[3] = 0;
  local_a98.data._M_elems[4] = 0;
  local_a98.data._M_elems[5] = 0;
  local_a98.data._M_elems[6] = 0;
  local_a98.data._M_elems[7] = 0;
  local_a98.data._M_elems[8] = 0;
  local_a98.data._M_elems[9] = 0;
  local_a98.data._M_elems[10] = 0;
  local_a98.data._M_elems[0xb] = 0;
  local_a98.data._M_elems[0xc] = 0;
  local_a98.data._M_elems[0xd] = 0;
  local_a98.data._M_elems[0xe] = 0;
  local_a98.data._M_elems[0xf] = 0;
  local_a98.data._M_elems[0x10] = 0;
  local_a98.data._M_elems[0x11] = 0;
  local_a98.data._M_elems[0x12] = 0;
  local_a98.data._M_elems[0x13] = 0;
  local_a98.data._M_elems[0x14] = 0;
  local_a98.data._M_elems[0x15] = 0;
  local_a98.data._M_elems[0x16] = 0;
  local_a98.data._M_elems[0x17] = 0;
  local_a98.data._M_elems[0x18] = 0;
  local_a98.data._M_elems[0x19] = 0;
  local_a98.data._M_elems._104_5_ = 0;
  local_a98.data._M_elems[0x1b]._1_3_ = 0;
  local_a98.exp = 0;
  local_a98.neg = false;
  local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x1c00000000;
  local_1038._0_4_ = 0;
  local_1038._4_4_ = 0;
  local_1038._8_4_ = 0;
  local_1038._12_4_ = 0;
  local_1038._16_4_ = 0;
  local_1038._20_4_ = 0;
  local_1038._24_4_ = 0;
  local_1038._28_4_ = 0;
  local_1038._32_4_ = 0;
  local_1038._36_4_ = 0;
  local_1038._40_4_ = 0;
  local_1038._44_4_ = 0;
  local_1038._48_4_ = 0;
  local_1038._52_4_ = 0;
  local_1038._56_4_ = 0;
  local_1038._60_4_ = 0;
  local_1038._64_4_ = 0;
  local_1038._68_4_ = 0;
  local_1038._72_4_ = 0;
  local_1038._76_4_ = 0;
  local_1038._80_4_ = 0;
  local_1038._84_4_ = 0;
  local_1038._88_4_ = 0;
  local_1038._92_4_ = 0;
  local_1038._96_4_ = 0;
  local_1038._100_4_ = 0;
  local_1038._104_5_ = 0;
  local_1038._109_3_ = 0;
  local_1038._112_4_ = 0;
  local_1038[0x74] = false;
  local_fb8 = this;
  local_fa8 = uvec;
  local_f98 = p_low;
  local_f90 = p_up;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_1038,10.0);
  if (&local_a98 != &p_delta->m_backend) {
    pnVar10 = p_delta;
    pcVar13 = &local_a98;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pcVar13->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
      pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar10 + ((ulong)bVar23 * -2 + 1) * 4);
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar23 * -2 + 1) * 4);
    }
    local_a98.exp = (p_delta->m_backend).exp;
    local_a98.neg = (p_delta->m_backend).neg;
    local_a98.fpclass = (p_delta->m_backend).fpclass;
    local_a98.prec_elem = (p_delta->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&local_a98,(cpp_dec_float<200U,_int,_void> *)local_1038);
  local_b18.fpclass = cpp_dec_float_finite;
  local_b18.prec_elem = 0x1c;
  local_b18.data._M_elems[0] = 0;
  local_b18.data._M_elems[1] = 0;
  local_b18.data._M_elems[2] = 0;
  local_b18.data._M_elems[3] = 0;
  local_b18.data._M_elems[4] = 0;
  local_b18.data._M_elems[5] = 0;
  local_b18.data._M_elems[6] = 0;
  local_b18.data._M_elems[7] = 0;
  local_b18.data._M_elems[8] = 0;
  local_b18.data._M_elems[9] = 0;
  local_b18.data._M_elems[10] = 0;
  local_b18.data._M_elems[0xb] = 0;
  local_b18.data._M_elems[0xc] = 0;
  local_b18.data._M_elems[0xd] = 0;
  local_b18.data._M_elems[0xe] = 0;
  local_b18.data._M_elems[0xf] = 0;
  local_b18.data._M_elems[0x10] = 0;
  local_b18.data._M_elems[0x11] = 0;
  local_b18.data._M_elems[0x12] = 0;
  local_b18.data._M_elems[0x13] = 0;
  local_b18.data._M_elems[0x14] = 0;
  local_b18.data._M_elems[0x15] = 0;
  local_b18.data._M_elems[0x16] = 0;
  local_b18.data._M_elems[0x17] = 0;
  local_b18.data._M_elems[0x18] = 0;
  local_b18.data._M_elems[0x19] = 0;
  local_b18.data._M_elems._104_5_ = 0;
  local_b18.data._M_elems[0x1b]._1_3_ = 0;
  local_b18.exp = 0;
  local_b18.neg = false;
  local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x1c00000000;
  local_1038._0_4_ = 0;
  local_1038._4_4_ = 0;
  local_1038._8_4_ = 0;
  local_1038._12_4_ = 0;
  local_1038._16_4_ = 0;
  local_1038._20_4_ = 0;
  local_1038._24_4_ = 0;
  local_1038._28_4_ = 0;
  local_1038._32_4_ = 0;
  local_1038._36_4_ = 0;
  local_1038._40_4_ = 0;
  local_1038._44_4_ = 0;
  local_1038._48_4_ = 0;
  local_1038._52_4_ = 0;
  local_1038._56_4_ = 0;
  local_1038._60_4_ = 0;
  local_1038._64_4_ = 0;
  local_1038._68_4_ = 0;
  local_1038._72_4_ = 0;
  local_1038._76_4_ = 0;
  local_1038._80_4_ = 0;
  local_1038._84_4_ = 0;
  local_1038._88_4_ = 0;
  local_1038._92_4_ = 0;
  local_1038._96_4_ = 0;
  local_1038._100_4_ = 0;
  local_1038._104_5_ = 0;
  local_1038._109_3_ = 0;
  local_1038._112_4_ = 0;
  local_1038[0x74] = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_1038,100.0);
  if (&local_b18 != &p_delta->m_backend) {
    pnVar10 = p_delta;
    pcVar13 = &local_b18;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pcVar13->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
      pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar10 + ((ulong)bVar23 * -2 + 1) * 4);
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar23 * -2 + 1) * 4);
    }
    local_b18.exp = (p_delta->m_backend).exp;
    local_b18.neg = (p_delta->m_backend).neg;
    local_b18.fpclass = (p_delta->m_backend).fpclass;
    local_b18.prec_elem = (p_delta->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&local_b18,(cpp_dec_float<200U,_int,_void> *)local_1038);
  local_da8._0_4_ = 0;
  local_da8._4_4_ = 0;
  local_da8._8_4_ = 0;
  local_da8._12_4_ = 0;
  local_da8._16_4_ = 0;
  local_da8._20_4_ = 0;
  local_da8._24_4_ = 0;
  local_da8._28_4_ = 0;
  local_da8._32_4_ = 0;
  local_da8._36_4_ = 0;
  local_da8._40_4_ = 0;
  local_da8._44_4_ = 0;
  local_da8._48_4_ = 0;
  local_da8._52_4_ = 0;
  local_da8._56_4_ = 0;
  local_da8._60_4_ = 0;
  local_da8._64_4_ = 0;
  local_da8._68_4_ = 0;
  local_da8._72_4_ = 0;
  local_da8._76_4_ = 0;
  local_da8._80_4_ = 0;
  local_da8._84_4_ = 0;
  local_da8._88_4_ = 0;
  local_da8._92_4_ = 0;
  local_da8._96_4_ = 0;
  local_da8._100_4_ = 0;
  local_da8._104_5_ = 0;
  local_da8._109_3_ = 0;
  local_eb8._0_4_ = 0;
  local_eb8._4_4_ = 0;
  local_eb8._8_4_ = 0;
  local_eb8._12_4_ = 0;
  local_eb8._16_4_ = 0;
  local_eb8._20_4_ = 0;
  local_eb8._24_4_ = 0;
  local_eb8._28_4_ = 0;
  local_eb8._32_4_ = 0;
  local_eb8._36_4_ = 0;
  local_eb8._40_4_ = 0;
  local_eb8._44_4_ = 0;
  local_eb8._48_4_ = 0;
  local_eb8._52_4_ = 0;
  local_eb8._56_4_ = 0;
  local_eb8._60_4_ = 0;
  local_eb8._64_4_ = 0;
  local_eb8._68_4_ = 0;
  local_eb8._72_4_ = 0;
  local_eb8._76_4_ = 0;
  local_eb8._80_4_ = 0;
  local_eb8._84_4_ = 0;
  local_eb8._88_4_ = 0;
  local_eb8._92_4_ = 0;
  local_eb8._96_4_ = 0;
  local_eb8._100_4_ = 0;
  local_eb8._104_5_ = 0;
  local_eb8._109_3_ = 0;
  local_e28._0_4_ = 0;
  local_e28._4_4_ = 0;
  local_e28._8_4_ = 0;
  local_e28._12_4_ = 0;
  local_e28._16_4_ = 0;
  local_e28._20_4_ = 0;
  local_e28._24_4_ = 0;
  local_e28._28_4_ = 0;
  local_e28._32_4_ = 0;
  local_e28._36_4_ = 0;
  local_e28._40_4_ = 0;
  local_e28._44_4_ = 0;
  local_e28._48_4_ = 0;
  local_e28._52_4_ = 0;
  local_e28._56_4_ = 0;
  local_e28._60_4_ = 0;
  local_e28._64_4_ = 0;
  local_e28._68_4_ = 0;
  local_e28._72_4_ = 0;
  local_e28._76_4_ = 0;
  local_e28._80_4_ = 0;
  local_e28._84_4_ = 0;
  local_e28._88_4_ = 0;
  local_e28._92_4_ = 0;
  local_e28._96_4_ = 0;
  local_e28._100_4_ = 0;
  local_e28._104_5_ = 0;
  local_e28._109_3_ = 0;
  local_fb0 = &eps->m_backend;
  if (local_fb8->fullPerturbation == true) {
    pnVar10 = p_delta;
    pnVar17 = eps;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar17->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
      pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar10 + ((ulong)bVar23 * -2 + 1) * 4);
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + ((ulong)bVar23 * -2 + 1) * 4);
    }
    (eps->m_backend).exp = (p_delta->m_backend).exp;
    (eps->m_backend).neg = (p_delta->m_backend).neg;
    iVar2 = (p_delta->m_backend).prec_elem;
    (eps->m_backend).fpclass = (p_delta->m_backend).fpclass;
    (eps->m_backend).prec_elem = iVar2;
    uVar20 = (int)((ulong)((long)(local_fa8->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_fa8->
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 7) + ~start;
    if (-1 < (int)uVar20) {
      local_f88 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&local_fb8->random;
      local_fb8 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&local_fb8->theShift;
      local_d28 = *(double *)(in_FS_OFFSET + -8);
      uStack_d20 = 0;
      local_f78 = (cpp_dec_float<200U,_int,_void> *)-*(double *)(in_FS_OFFSET + -8);
      uStack_f70 = 0x8000000000000000;
      do {
        uVar21 = (ulong)uVar20;
        pnVar11 = (local_f90->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_ed0 = (SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)uVar21;
        pnVar14 = pnVar11 + uVar21;
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_e28;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar13->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (pointer)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar23 * -8 + 4);
        }
        iVar6 = pnVar11[uVar21].m_backend.exp;
        local_e28._112_4_ = iVar6;
        bVar5 = pnVar11[uVar21].m_backend.neg;
        local_e28[0x74] = bVar5;
        fVar1 = pnVar11[uVar21].m_backend.fpclass;
        iVar2 = pnVar11[uVar21].m_backend.prec_elem;
        iStack_dac = iVar2;
        local_e28._120_4_ = fVar1;
        pnVar11 = (local_f98->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar14 = pnVar11 + uVar21;
        puVar12 = (uint *)local_eb8;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar12 = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (pointer)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
          puVar12 = puVar12 + (ulong)bVar23 * -2 + 1;
        }
        local_eb8._112_4_ = pnVar11[uVar21].m_backend.exp;
        local_eb8[0x74] = pnVar11[uVar21].m_backend.neg;
        local_eb8._120_4_ = pnVar11[uVar21].m_backend.fpclass;
        local_eb8._124_4_ = pnVar11[uVar21].m_backend.prec_elem;
        pnVar11 = local_ed8 + uVar21;
        puVar15 = (undefined4 *)local_da8;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar15 = *(undefined4 *)&pnVar11->m_backend;
          pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar23 * -2 + 1) * 4);
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
        }
        local_da8._112_4_ = *(int *)((long)(local_ed8 + uVar21) + 0x70);
        local_da8[0x74] = *(bool *)((long)(local_ed8 + uVar21) + 0x74);
        local_da8._120_8_ =
             *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               **)((long)(local_ed8 + uVar21) + 0x78);
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_e28;
        pnVar10 = &local_910;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar10->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar23 * -8 + 4);
          pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar10 + ((ulong)bVar23 * -2 + 1) * 4);
        }
        local_910.m_backend.exp = iVar6;
        local_910.m_backend.neg = bVar5;
        local_910.m_backend.fpclass = fVar1;
        local_910.m_backend.prec_elem = iVar2;
        ::soplex::infinity::__tls_init();
        local_b20 = 0x1c00000000;
        local_b98 = 0;
        uStack_b90 = 0;
        local_b88 = 0;
        uStack_b80 = 0;
        local_b78 = 0;
        uStack_b70 = 0;
        local_b68 = 0;
        uStack_b60 = 0;
        local_b58 = 0;
        uStack_b50 = 0;
        local_b48 = 0;
        uStack_b40 = 0;
        local_b38 = 0;
        uStack_b30 = 0;
        uStack_b2b = 0;
        uStack_b28 = 0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_b98,local_d28);
        lVar9 = 0x1c;
        pcVar13 = &eps->m_backend;
        pnVar10 = &local_190;
        for (; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar10->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar23 * -8 + 4);
          pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar10 + ((ulong)bVar23 * -2 + 1) * 4);
        }
        local_190.m_backend.exp = (eps->m_backend).exp;
        local_190.m_backend.neg = (eps->m_backend).neg;
        local_190.m_backend.fpclass = (eps->m_backend).fpclass;
        local_190.m_backend.prec_elem = (eps->m_backend).prec_elem;
        bVar5 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_910,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_b98,&local_190);
        if (bVar5) {
          puVar12 = (uint *)local_eb8;
          pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_210;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar10->m_backend).data._M_elems[0] = *puVar12;
            puVar12 = puVar12 + (ulong)bVar23 * -2 + 1;
            pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar10 + ((ulong)bVar23 * -2 + 1) * 4);
          }
          local_210._112_4_ = local_eb8._112_4_;
          local_210[0x74] = local_eb8[0x74];
          local_210._120_8_ = local_eb8._120_8_;
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_e28;
          pnVar10 = &local_290;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar10->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar23 * -8 + 4);
            pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar10 + ((ulong)bVar23 * -2 + 1) * 4);
          }
          local_290.m_backend.exp = local_e28._112_4_;
          local_290.m_backend.neg = local_e28[0x74];
          local_290.m_backend.fpclass = local_e28._120_4_;
          local_290.m_backend.prec_elem = iStack_dac;
          lVar9 = 0x1c;
          pcVar13 = &eps->m_backend;
          pnVar10 = &local_310;
          for (; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar10->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar23 * -8 + 4);
            pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar10 + ((ulong)bVar23 * -2 + 1) * 4);
          }
          local_310.m_backend.exp = (eps->m_backend).exp;
          local_310.m_backend.neg = (eps->m_backend).neg;
          local_310.m_backend.fpclass = (eps->m_backend).fpclass;
          local_310.m_backend.prec_elem = (eps->m_backend).prec_elem;
          bVar5 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_210,&local_290,&local_310);
          if (bVar5) {
            local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x1c00000000;
            local_1038._0_4_ = 0;
            local_1038._4_4_ = 0;
            local_1038._8_4_ = 0;
            local_1038._12_4_ = 0;
            local_1038._16_4_ = 0;
            local_1038._20_4_ = 0;
            local_1038._24_4_ = 0;
            local_1038._28_4_ = 0;
            local_1038._32_4_ = 0;
            local_1038._36_4_ = 0;
            local_1038._40_4_ = 0;
            local_1038._44_4_ = 0;
            local_1038._48_4_ = 0;
            local_1038._52_4_ = 0;
            local_1038._56_4_ = 0;
            local_1038._60_4_ = 0;
            local_1038._64_4_ = 0;
            local_1038._68_4_ = 0;
            local_1038._72_4_ = 0;
            local_1038._76_4_ = 0;
            local_1038._80_4_ = 0;
            local_1038._84_4_ = 0;
            local_1038._88_4_ = 0;
            local_1038._92_4_ = 0;
            local_1038._96_4_ = 0;
            local_1038._100_4_ = 0;
            local_1038._104_5_ = 0;
            local_1038._109_3_ = 0;
            local_1038._112_4_ = 0;
            local_1038[0x74] = false;
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_da8;
            if ((cpp_dec_float<200U,_int,_void> *)local_1038 != &eps->m_backend) {
              puVar12 = (uint *)local_1038;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                *puVar12 = (pcVar13->data)._M_elems[0];
                pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar23 * -8 + 4)
                ;
                puVar12 = puVar12 + (ulong)bVar23 * -2 + 1;
              }
              local_1038._112_4_ = local_da8._112_4_;
              local_1038[0x74] = local_da8[0x74];
              local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)local_da8._120_8_;
              pcVar13 = &eps->m_backend;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_1038,pcVar13);
            if (((local_e28._120_4_ != cpp_dec_float_NaN) &&
                ((fpclass_type)local_fc0 != cpp_dec_float_NaN)) &&
               (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  ((cpp_dec_float<200U,_int,_void> *)local_e28,
                                   (cpp_dec_float<200U,_int,_void> *)local_1038), iVar6 < 1)) {
              local_fa8 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             extract_double(&local_a98);
              local_ec8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          extract_double(&local_b18);
              RVar3 = Random::next_random((Random *)local_f88);
              local_ef0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x1c00000000;
              local_f68._0_4_ = 0;
              local_f68._4_4_ = 0;
              local_f68._8_4_ = 0;
              local_f68._12_4_ = 0;
              local_f68._16_4_ = 0;
              local_f68._20_4_ = 0;
              local_f68._24_4_ = 0;
              local_f68._28_4_ = 0;
              local_f68._32_4_ = 0;
              local_f68._36_4_ = 0;
              local_f68._40_4_ = 0;
              local_f68._44_4_ = 0;
              local_f68._48_4_ = 0;
              local_f68._52_4_ = 0;
              local_f68._56_4_ = 0;
              local_f68._60_4_ = 0;
              local_f68._64_4_ = 0;
              local_f68._68_4_ = 0;
              local_f68._72_4_ = 0;
              local_f68._76_4_ = 0;
              local_f68._80_4_ = 0;
              local_f68._84_4_ = 0;
              local_f68._88_4_ = 0;
              local_f68._92_4_ = 0;
              local_f68._96_4_ = 0;
              local_f68._100_4_ = 0;
              local_f68._104_5_ = 0;
              local_f68._109_3_ = 0;
              local_f68._112_4_ = 0;
              local_f68[0x74] = false;
              local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x1c00000000;
              local_1038._0_4_ = 0;
              local_1038._4_4_ = 0;
              local_1038._8_4_ = 0;
              local_1038._12_4_ = 0;
              local_1038._16_4_ = 0;
              local_1038._20_4_ = 0;
              local_1038._24_4_ = 0;
              local_1038._28_4_ = 0;
              local_1038._32_4_ = 0;
              local_1038._36_4_ = 0;
              local_1038._40_4_ = 0;
              local_1038._44_4_ = 0;
              local_1038._48_4_ = 0;
              local_1038._52_4_ = 0;
              local_1038._56_4_ = 0;
              local_1038._60_4_ = 0;
              local_1038._64_4_ = 0;
              local_1038._68_4_ = 0;
              local_1038._72_4_ = 0;
              local_1038._76_4_ = 0;
              local_1038._80_4_ = 0;
              local_1038._84_4_ = 0;
              local_1038._88_4_ = 0;
              local_1038._92_4_ = 0;
              local_1038._96_4_ = 0;
              local_1038._100_4_ = 0;
              local_1038._104_5_ = 0;
              local_1038._109_3_ = 0;
              local_1038._112_4_ = 0;
              local_1038[0x74] = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_1038,
                         RVar3 * local_ec8 + (1.0 - RVar3) * (double)local_fa8);
              puVar12 = (uint *)local_da8;
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_f68;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pcVar13->data)._M_elems[0] = *puVar12;
                puVar12 = puVar12 + (ulong)bVar23 * -2 + 1;
                pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar23 * -8 + 4)
                ;
              }
              local_f68._112_4_ = local_da8._112_4_;
              local_f68[0x74] = local_da8[0x74];
              local_ef0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)local_da8._120_8_;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_f68,
                         (cpp_dec_float<200U,_int,_void> *)local_1038);
              pnVar11 = (local_f90->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_f68;
              pnVar14 = pnVar11 + uVar21;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pnVar14->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
                pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar23 * -8 + 4)
                ;
                pnVar14 = (pointer)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
              }
              pnVar11[uVar21].m_backend.exp = local_f68._112_4_;
              pnVar11[uVar21].m_backend.neg = local_f68[0x74];
              *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                **)&pnVar11[uVar21].m_backend.fpclass = local_ef0;
              pnVar11 = (local_f90->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar21;
              local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x1c00000000;
              local_1038._0_4_ = 0;
              local_1038._4_4_ = 0;
              local_1038._8_4_ = 0;
              local_1038._12_4_ = 0;
              local_1038._16_4_ = 0;
              local_1038._20_4_ = 0;
              local_1038._24_4_ = 0;
              local_1038._28_4_ = 0;
              local_1038._32_4_ = 0;
              local_1038._36_4_ = 0;
              local_1038._40_4_ = 0;
              local_1038._44_4_ = 0;
              local_1038._48_4_ = 0;
              local_1038._52_4_ = 0;
              local_1038._56_4_ = 0;
              local_1038._60_4_ = 0;
              local_1038._64_4_ = 0;
              local_1038._68_4_ = 0;
              local_1038._72_4_ = 0;
              local_1038._76_4_ = 0;
              local_1038._80_4_ = 0;
              local_1038._84_4_ = 0;
              local_1038._88_4_ = 0;
              local_1038._92_4_ = 0;
              local_1038._96_4_ = 0;
              local_1038._100_4_ = 0;
              local_1038._104_5_ = 0;
              local_1038._109_3_ = 0;
              local_1038._112_4_ = 0;
              local_1038[0x74] = false;
              if ((pointer)local_1038 != pnVar11) {
                pnVar14 = pnVar11;
                puVar15 = (undefined4 *)local_1038;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  *puVar15 = (pnVar14->m_backend).data._M_elems[0];
                  pnVar14 = (pointer)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
                  puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                }
                local_1038._112_4_ = (pnVar11->m_backend).exp;
                local_1038[0x74] = (pnVar11->m_backend).neg;
                local_fc0 = *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              **)&(pnVar11->m_backend).fpclass;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_1038,
                         (cpp_dec_float<200U,_int,_void> *)local_e28);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_fb8,
                         (cpp_dec_float<200U,_int,_void> *)local_1038);
            }
          }
        }
        bVar5 = local_eb8[0x74];
        uVar4 = local_eb8._112_4_;
        puVar15 = (undefined4 *)local_eb8;
        puVar18 = local_a0;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar18 = *puVar15;
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
          puVar18 = puVar18 + (ulong)bVar23 * -2 + 1;
        }
        local_fa8 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)local_eb8._120_8_;
        uStack_fa0 = 0;
        ::soplex::infinity::__tls_init();
        local_c18.fpclass = cpp_dec_float_finite;
        local_c18.prec_elem = 0x1c;
        local_c18.data._M_elems[0] = 0;
        local_c18.data._M_elems[1] = 0;
        local_c18.data._M_elems[2] = 0;
        local_c18.data._M_elems[3] = 0;
        local_c18.data._M_elems[4] = 0;
        local_c18.data._M_elems[5] = 0;
        local_c18.data._M_elems[6] = 0;
        local_c18.data._M_elems[7] = 0;
        local_c18.data._M_elems[8] = 0;
        local_c18.data._M_elems[9] = 0;
        local_c18.data._M_elems[10] = 0;
        local_c18.data._M_elems[0xb] = 0;
        local_c18.data._M_elems[0xc] = 0;
        local_c18.data._M_elems[0xd] = 0;
        local_c18.data._M_elems[0xe] = 0;
        local_c18.data._M_elems[0xf] = 0;
        local_c18.data._M_elems[0x10] = 0;
        local_c18.data._M_elems[0x11] = 0;
        local_c18.data._M_elems[0x12] = 0;
        local_c18.data._M_elems[0x13] = 0;
        local_c18.data._M_elems[0x14] = 0;
        local_c18.data._M_elems[0x15] = 0;
        local_c18.data._M_elems[0x16] = 0;
        local_c18.data._M_elems[0x17] = 0;
        local_c18.data._M_elems[0x18] = 0;
        local_c18.data._M_elems[0x19] = 0;
        local_c18.data._M_elems._104_5_ = 0;
        local_c18.data._M_elems[0x1b]._1_3_ = 0;
        local_c18.exp = 0;
        local_c18.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_c18,(double)local_f78);
        pcVar13 = local_fb0;
        pcVar19 = &local_990;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar19->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar23 * -8 + 4);
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + ((ulong)bVar23 * -2 + 1) * 4)
          ;
        }
        local_990.exp = local_fb0->exp;
        local_990.neg = local_fb0->neg;
        local_990.fpclass = local_fb0->fpclass;
        local_990.prec_elem = local_fb0->prec_elem;
        puVar15 = local_a0;
        puVar18 = (undefined4 *)local_1038;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar18 = *puVar15;
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
          puVar18 = puVar18 + (ulong)bVar23 * -2 + 1;
        }
        local_1038._112_4_ = uVar4;
        local_1038[0x74] = bVar5;
        local_fc0 = local_fa8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  ((cpp_dec_float<200U,_int,_void> *)local_1038,&local_c18);
        eps = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_fb0;
        if (((fpclass_type)local_fc0 != cpp_dec_float_NaN) &&
           (local_990.fpclass != cpp_dec_float_NaN)) {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_1038,&local_990);
          eps = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_fb0;
          if (0 < iVar6) {
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_eb8;
            pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_390;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pnVar10->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar23 * -8 + 4);
              pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar10 + ((ulong)bVar23 * -2 + 1) * 4);
            }
            local_390._112_4_ = local_eb8._112_4_;
            local_390[0x74] = local_eb8[0x74];
            local_390._120_8_ = local_eb8._120_8_;
            puVar12 = (uint *)local_e28;
            pnVar10 = &local_410;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pnVar10->m_backend).data._M_elems[0] = *puVar12;
              puVar12 = puVar12 + (ulong)bVar23 * -2 + 1;
              pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar10 + ((ulong)bVar23 * -2 + 1) * 4);
            }
            local_410.m_backend.exp = local_e28._112_4_;
            local_410.m_backend.neg = local_e28[0x74];
            local_410.m_backend.fpclass = local_e28._120_4_;
            local_410.m_backend.prec_elem = iStack_dac;
            pcVar13 = local_fb0;
            pnVar10 = &local_490;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pnVar10->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar23 * -8 + 4);
              pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar10 + ((ulong)bVar23 * -2 + 1) * 4);
            }
            local_490.m_backend.exp = local_fb0->exp;
            local_490.m_backend.neg = local_fb0->neg;
            local_490.m_backend.fpclass = local_fb0->fpclass;
            local_490.m_backend.prec_elem = local_fb0->prec_elem;
            bVar5 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_390,&local_410,&local_490);
            if (bVar5) {
              local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x1c00000000;
              local_1038._0_4_ = 0;
              local_1038._4_4_ = 0;
              local_1038._8_4_ = 0;
              local_1038._12_4_ = 0;
              local_1038._16_4_ = 0;
              local_1038._20_4_ = 0;
              local_1038._24_4_ = 0;
              local_1038._28_4_ = 0;
              local_1038._32_4_ = 0;
              local_1038._36_4_ = 0;
              local_1038._40_4_ = 0;
              local_1038._44_4_ = 0;
              local_1038._48_4_ = 0;
              local_1038._52_4_ = 0;
              local_1038._56_4_ = 0;
              local_1038._60_4_ = 0;
              local_1038._64_4_ = 0;
              local_1038._68_4_ = 0;
              local_1038._72_4_ = 0;
              local_1038._76_4_ = 0;
              local_1038._80_4_ = 0;
              local_1038._84_4_ = 0;
              local_1038._88_4_ = 0;
              local_1038._92_4_ = 0;
              local_1038._96_4_ = 0;
              local_1038._100_4_ = 0;
              local_1038._104_5_ = 0;
              local_1038._109_3_ = 0;
              local_1038._112_4_ = 0;
              local_1038[0x74] = false;
              if ((cpp_dec_float<200U,_int,_void> *)local_1038 == &eps->m_backend) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_1038,
                           (cpp_dec_float<200U,_int,_void> *)local_da8);
                if (local_1038._0_4_ != 0 || (fpclass_type)local_fc0 != cpp_dec_float_finite) {
                  local_1038[0x74] = local_1038[0x74] ^ 1;
                }
              }
              else {
                pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_da8;
                puVar12 = (uint *)local_1038;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  *puVar12 = (pcVar13->data)._M_elems[0];
                  pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar13 + (ulong)bVar23 * -8 + 4);
                  puVar12 = puVar12 + (ulong)bVar23 * -2 + 1;
                }
                local_1038._112_4_ = local_da8._112_4_;
                local_1038[0x74] = local_da8[0x74];
                local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)local_da8._120_8_;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_1038,&eps->m_backend);
              }
              if (((local_eb8._120_4_ != cpp_dec_float_NaN) &&
                  ((fpclass_type)local_fc0 != cpp_dec_float_NaN)) &&
                 (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)local_eb8,
                                     (cpp_dec_float<200U,_int,_void> *)local_1038), -1 < iVar6)) {
                local_fa8 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                               extract_double(&local_a98);
                local_ec8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            extract_double(&local_b18);
                RVar3 = Random::next_random((Random *)local_f88);
                local_ef0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x1c00000000;
                local_f68._0_4_ = 0;
                local_f68._4_4_ = 0;
                local_f68._8_4_ = 0;
                local_f68._12_4_ = 0;
                local_f68._16_4_ = 0;
                local_f68._20_4_ = 0;
                local_f68._24_4_ = 0;
                local_f68._28_4_ = 0;
                local_f68._32_4_ = 0;
                local_f68._36_4_ = 0;
                local_f68._40_4_ = 0;
                local_f68._44_4_ = 0;
                local_f68._48_4_ = 0;
                local_f68._52_4_ = 0;
                local_f68._56_4_ = 0;
                local_f68._60_4_ = 0;
                local_f68._64_4_ = 0;
                local_f68._68_4_ = 0;
                local_f68._72_4_ = 0;
                local_f68._76_4_ = 0;
                local_f68._80_4_ = 0;
                local_f68._84_4_ = 0;
                local_f68._88_4_ = 0;
                local_f68._92_4_ = 0;
                local_f68._96_4_ = 0;
                local_f68._100_4_ = 0;
                local_f68._104_5_ = 0;
                local_f68._109_3_ = 0;
                local_f68._112_4_ = 0;
                local_f68[0x74] = false;
                local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x1c00000000;
                local_1038._0_4_ = 0;
                local_1038._4_4_ = 0;
                local_1038._8_4_ = 0;
                local_1038._12_4_ = 0;
                local_1038._16_4_ = 0;
                local_1038._20_4_ = 0;
                local_1038._24_4_ = 0;
                local_1038._28_4_ = 0;
                local_1038._32_4_ = 0;
                local_1038._36_4_ = 0;
                local_1038._40_4_ = 0;
                local_1038._44_4_ = 0;
                local_1038._48_4_ = 0;
                local_1038._52_4_ = 0;
                local_1038._56_4_ = 0;
                local_1038._60_4_ = 0;
                local_1038._64_4_ = 0;
                local_1038._68_4_ = 0;
                local_1038._72_4_ = 0;
                local_1038._76_4_ = 0;
                local_1038._80_4_ = 0;
                local_1038._84_4_ = 0;
                local_1038._88_4_ = 0;
                local_1038._92_4_ = 0;
                local_1038._96_4_ = 0;
                local_1038._100_4_ = 0;
                local_1038._104_5_ = 0;
                local_1038._109_3_ = 0;
                local_1038._112_4_ = 0;
                local_1038[0x74] = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)local_1038,
                           RVar3 * local_ec8 + (1.0 - RVar3) * (double)local_fa8);
                puVar12 = (uint *)local_da8;
                pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_f68;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pcVar13->data)._M_elems[0] = *puVar12;
                  puVar12 = puVar12 + (ulong)bVar23 * -2 + 1;
                  pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar13 + (ulong)bVar23 * -8 + 4);
                }
                local_f68._112_4_ = local_da8._112_4_;
                local_f68[0x74] = local_da8[0x74];
                local_ef0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)local_da8._120_8_;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_f68,
                           (cpp_dec_float<200U,_int,_void> *)local_1038);
                pnVar11 = (local_f98->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_f68;
                pnVar14 = pnVar11 + uVar21;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pnVar14->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
                  pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar13 + (ulong)bVar23 * -8 + 4);
                  pnVar14 = (pointer)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
                }
                pnVar11[uVar21].m_backend.exp = local_f68._112_4_;
                pnVar11[uVar21].m_backend.neg = local_f68[0x74];
                *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)&pnVar11[uVar21].m_backend.fpclass = local_ef0;
                pnVar11 = (local_f98->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar21;
                local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x1c00000000;
                local_1038._0_4_ = 0;
                local_1038._4_4_ = 0;
                local_1038._8_4_ = 0;
                local_1038._12_4_ = 0;
                local_1038._16_4_ = 0;
                local_1038._20_4_ = 0;
                local_1038._24_4_ = 0;
                local_1038._28_4_ = 0;
                local_1038._32_4_ = 0;
                local_1038._36_4_ = 0;
                local_1038._40_4_ = 0;
                local_1038._44_4_ = 0;
                local_1038._48_4_ = 0;
                local_1038._52_4_ = 0;
                local_1038._56_4_ = 0;
                local_1038._60_4_ = 0;
                local_1038._64_4_ = 0;
                local_1038._68_4_ = 0;
                local_1038._72_4_ = 0;
                local_1038._76_4_ = 0;
                local_1038._80_4_ = 0;
                local_1038._84_4_ = 0;
                local_1038._88_4_ = 0;
                local_1038._92_4_ = 0;
                local_1038._96_4_ = 0;
                local_1038._100_4_ = 0;
                local_1038._104_5_ = 0;
                local_1038._109_3_ = 0;
                local_1038._112_4_ = 0;
                local_1038[0x74] = false;
                if ((pointer)local_1038 != pnVar11) {
                  pnVar14 = pnVar11;
                  puVar15 = (undefined4 *)local_1038;
                  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                    *puVar15 = (pnVar14->m_backend).data._M_elems[0];
                    pnVar14 = (pointer)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
                    puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                  }
                  local_1038._112_4_ = (pnVar11->m_backend).exp;
                  local_1038[0x74] = (pnVar11->m_backend).neg;
                  local_fc0 = *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                **)&(pnVar11->m_backend).fpclass;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_1038,
                           (cpp_dec_float<200U,_int,_void> *)local_eb8);
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_fb8,
                           (cpp_dec_float<200U,_int,_void> *)local_1038);
              }
            }
          }
        }
        uVar20 = (int)local_ed0 - incr;
      } while (-1 < (int)uVar20);
    }
  }
  else {
    uVar20 = ~start + (local_fa8->thedelta).super_IdxSet.num;
    if (-1 < (int)uVar20) {
      pnVar11 = (local_fa8->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_ed0 = &local_fb8->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      local_d28 = *(double *)(in_FS_OFFSET + -8);
      local_e30 = &local_fb8->random;
      local_e38 = &(local_fb8->theShift).m_backend;
      uStack_d20 = 0;
      local_ec8 = -local_d28;
      uStack_ec0 = 0x8000000000000000;
      pUVar22 = local_fa8;
      do {
        iVar6 = (pUVar22->thedelta).super_IdxSet.idx[uVar20];
        pnVar14 = pnVar11 + iVar6;
        puVar15 = (undefined4 *)local_da8;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar15 = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (pointer)((long)pnVar14 + ((ulong)bVar23 * -2 + 1) * 4);
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
        }
        local_da8._112_4_ = pnVar11[iVar6].m_backend.exp;
        local_da8[0x74] = pnVar11[iVar6].m_backend.neg;
        local_da8._120_4_ = pnVar11[iVar6].m_backend.fpclass;
        local_da8._124_4_ = pnVar11[iVar6].m_backend.prec_elem;
        pnVar14 = (local_f90->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar16 = pnVar14 + iVar6;
        puVar15 = (undefined4 *)local_e28;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar15 = (pnVar16->m_backend).data._M_elems[0];
          pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
        }
        local_e28._112_4_ = pnVar14[iVar6].m_backend.exp;
        local_e28[0x74] = pnVar14[iVar6].m_backend.neg;
        unique0x00012000 =
             *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               **)&pnVar14[iVar6].m_backend.fpclass;
        pnVar14 = (local_f98->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar16 = pnVar14 + iVar6;
        puVar15 = (undefined4 *)local_eb8;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar15 = (pnVar16->m_backend).data._M_elems[0];
          pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
        }
        local_eb8._112_4_ = pnVar14[iVar6].m_backend.exp;
        local_eb8[0x74] = pnVar14[iVar6].m_backend.neg;
        local_eb8._120_8_ = *(undefined8 *)&pnVar14[iVar6].m_backend.fpclass;
        SVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::dualStatus(local_ed0,
                             (local_fb8->
                             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).theBaseId.data + iVar6);
        if (SVar7 != D_ON_BOTH) {
          if (((local_da8._120_4_ == cpp_dec_float_NaN) ||
              ((eps->m_backend).fpclass == cpp_dec_float_NaN)) ||
             (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_da8,&eps->m_backend),
             iVar8 < 1)) {
            lVar9 = 0x1c;
            pcVar13 = &eps->m_backend;
            puVar12 = (uint *)local_1038;
            for (; lVar9 != 0; lVar9 = lVar9 + -1) {
              *puVar12 = (pcVar13->data)._M_elems[0];
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar23 * -8 + 4);
              puVar12 = puVar12 + (ulong)bVar23 * -2 + 1;
            }
            local_1038._112_4_ = (eps->m_backend).exp;
            local_1038[0x74] = (eps->m_backend).neg;
            local_fc0 = *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          **)&(eps->m_backend).fpclass;
            if (local_1038._0_4_ != 0 || (int)local_fc0 != 0) {
              local_1038[0x74] = local_1038[0x74] ^ 1;
            }
            if ((((int)local_fc0 != 2) && (local_da8._120_4_ != cpp_dec_float_NaN)) &&
               (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  ((cpp_dec_float<200U,_int,_void> *)local_da8,
                                   (cpp_dec_float<200U,_int,_void> *)local_1038),
               uVar4 = local_eb8._112_4_, iVar8 < 0)) {
              puVar15 = (undefined4 *)local_eb8;
              puVar18 = local_110;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                *puVar18 = *puVar15;
                puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                puVar18 = puVar18 + (ulong)bVar23 * -2 + 1;
              }
              local_f78 = (cpp_dec_float<200U,_int,_void> *)
                          CONCAT71(local_f78._1_7_,local_eb8[0x74]);
              local_f88 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)local_eb8._120_8_;
              uStack_f80 = 0;
              ::soplex::infinity::__tls_init();
              local_d18.fpclass = cpp_dec_float_finite;
              local_d18.prec_elem = 0x1c;
              local_d18.data._M_elems[0] = 0;
              local_d18.data._M_elems[1] = 0;
              local_d18.data._M_elems[2] = 0;
              local_d18.data._M_elems[3] = 0;
              local_d18.data._M_elems[4] = 0;
              local_d18.data._M_elems[5] = 0;
              local_d18.data._M_elems[6] = 0;
              local_d18.data._M_elems[7] = 0;
              local_d18.data._M_elems[8] = 0;
              local_d18.data._M_elems[9] = 0;
              local_d18.data._M_elems[10] = 0;
              local_d18.data._M_elems[0xb] = 0;
              local_d18.data._M_elems[0xc] = 0;
              local_d18.data._M_elems[0xd] = 0;
              local_d18.data._M_elems[0xe] = 0;
              local_d18.data._M_elems[0xf] = 0;
              local_d18.data._M_elems[0x10] = 0;
              local_d18.data._M_elems[0x11] = 0;
              local_d18.data._M_elems[0x12] = 0;
              local_d18.data._M_elems[0x13] = 0;
              local_d18.data._M_elems[0x14] = 0;
              local_d18.data._M_elems[0x15] = 0;
              local_d18.data._M_elems[0x16] = 0;
              local_d18.data._M_elems[0x17] = 0;
              local_d18.data._M_elems[0x18] = 0;
              local_d18.data._M_elems[0x19] = 0;
              local_d18.data._M_elems._104_5_ = 0;
              local_d18.data._M_elems[0x1b]._1_3_ = 0;
              local_d18.exp = 0;
              local_d18.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_d18,local_ec8);
              pcVar13 = local_fb0;
              pcVar19 = &local_a10;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pcVar19->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
                pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar23 * -8 + 4)
                ;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar19 + ((ulong)bVar23 * -2 + 1) * 4);
              }
              local_a10.exp = local_fb0->exp;
              local_a10.neg = local_fb0->neg;
              local_a10.fpclass = local_fb0->fpclass;
              local_a10.prec_elem = local_fb0->prec_elem;
              puVar15 = local_110;
              puVar18 = (undefined4 *)local_1038;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                *puVar18 = *puVar15;
                puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                puVar18 = puVar18 + (ulong)bVar23 * -2 + 1;
              }
              local_1038._112_4_ = uVar4;
              local_1038[0x74] = (byte)local_f78;
              local_fc0 = local_f88;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_1038,&local_d18);
              eps = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_fb0;
              pUVar22 = local_fa8;
              if ((((fpclass_type)local_fc0 != cpp_dec_float_NaN) &&
                  (local_a10.fpclass != cpp_dec_float_NaN)) &&
                 (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)local_1038,&local_a10),
                 pUVar22 = local_fa8,
                 eps = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_fb0, 0 < iVar8)) {
                puVar12 = (uint *)local_eb8;
                pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_710;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pnVar10->m_backend).data._M_elems[0] = *puVar12;
                  puVar12 = puVar12 + (ulong)bVar23 * -2 + 1;
                  pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar10 + ((ulong)bVar23 * -2 + 1) * 4);
                }
                local_710._112_4_ = local_eb8._112_4_;
                local_710[0x74] = local_eb8[0x74];
                local_710._120_8_ = local_eb8._120_8_;
                puVar12 = (uint *)local_e28;
                pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_790;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pnVar10->m_backend).data._M_elems[0] = *puVar12;
                  puVar12 = puVar12 + (ulong)bVar23 * -2 + 1;
                  pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar10 + ((ulong)bVar23 * -2 + 1) * 4);
                }
                local_790._112_4_ = local_e28._112_4_;
                local_790[0x74] = local_e28[0x74];
                local_790._120_8_ = stack0xfffffffffffff250;
                pcVar13 = local_fb0;
                pnVar10 = &local_810;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pnVar10->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
                  pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar13 + (ulong)bVar23 * -8 + 4);
                  pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar10 + ((ulong)bVar23 * -2 + 1) * 4);
                }
                local_810.m_backend.exp = local_fb0->exp;
                local_810.m_backend.neg = local_fb0->neg;
                local_810.m_backend.fpclass = local_fb0->fpclass;
                local_810.m_backend.prec_elem = local_fb0->prec_elem;
                bVar5 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)local_710,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)local_790,&local_810);
                if (bVar5) {
                  local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x1c00000000;
                  local_1038._0_4_ = 0;
                  local_1038._4_4_ = 0;
                  local_1038._8_4_ = 0;
                  local_1038._12_4_ = 0;
                  local_1038._16_4_ = 0;
                  local_1038._20_4_ = 0;
                  local_1038._24_4_ = 0;
                  local_1038._28_4_ = 0;
                  local_1038._32_4_ = 0;
                  local_1038._36_4_ = 0;
                  local_1038._40_4_ = 0;
                  local_1038._44_4_ = 0;
                  local_1038._48_4_ = 0;
                  local_1038._52_4_ = 0;
                  local_1038._56_4_ = 0;
                  local_1038._60_4_ = 0;
                  local_1038._64_4_ = 0;
                  local_1038._68_4_ = 0;
                  local_1038._72_4_ = 0;
                  local_1038._76_4_ = 0;
                  local_1038._80_4_ = 0;
                  local_1038._84_4_ = 0;
                  local_1038._88_4_ = 0;
                  local_1038._92_4_ = 0;
                  local_1038._96_4_ = 0;
                  local_1038._100_4_ = 0;
                  local_1038._104_5_ = 0;
                  local_1038._109_3_ = 0;
                  local_1038._112_4_ = 0;
                  local_1038[0x74] = false;
                  pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_eb8;
                  if ((cpp_dec_float<200U,_int,_void> *)local_1038 != &eps->m_backend) {
                    puVar12 = (uint *)local_1038;
                    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                      *puVar12 = (pcVar13->data)._M_elems[0];
                      pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar13 + (ulong)bVar23 * -8 + 4);
                      puVar12 = puVar12 + (ulong)bVar23 * -2 + 1;
                    }
                    local_1038._112_4_ = local_eb8._112_4_;
                    local_1038[0x74] = local_eb8[0x74];
                    local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)local_eb8._120_8_;
                    pcVar13 = &eps->m_backend;
                  }
                  local_f78 = &local_ed8[iVar6].m_backend;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                            ((cpp_dec_float<200U,_int,_void> *)local_1038,pcVar13);
                  if (((local_f78->fpclass != cpp_dec_float_NaN) &&
                      ((fpclass_type)local_fc0 != cpp_dec_float_NaN)) &&
                     (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              compare(local_f78,(cpp_dec_float<200U,_int,_void> *)local_1038),
                     iVar8 < 1)) {
                    local_f88 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                   extract_double(&local_a98);
                    local_ee0 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                extract_double(&local_b18);
                    RVar3 = Random::next_random(local_e30);
                    local_ef0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)0x1c00000000;
                    local_f68._0_4_ = 0;
                    local_f68._4_4_ = 0;
                    local_f68._8_4_ = 0;
                    local_f68._12_4_ = 0;
                    local_f68._16_4_ = 0;
                    local_f68._20_4_ = 0;
                    local_f68._24_4_ = 0;
                    local_f68._28_4_ = 0;
                    local_f68._32_4_ = 0;
                    local_f68._36_4_ = 0;
                    local_f68._40_4_ = 0;
                    local_f68._44_4_ = 0;
                    local_f68._48_4_ = 0;
                    local_f68._52_4_ = 0;
                    local_f68._56_4_ = 0;
                    local_f68._60_4_ = 0;
                    local_f68._64_4_ = 0;
                    local_f68._68_4_ = 0;
                    local_f68._72_4_ = 0;
                    local_f68._76_4_ = 0;
                    local_f68._80_4_ = 0;
                    local_f68._84_4_ = 0;
                    local_f68._88_4_ = 0;
                    local_f68._92_4_ = 0;
                    local_f68._96_4_ = 0;
                    local_f68._100_4_ = 0;
                    local_f68._104_5_ = 0;
                    local_f68._109_3_ = 0;
                    local_f68._112_4_ = 0;
                    local_f68[0x74] = false;
                    local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)0x1c00000000;
                    local_1038._0_4_ = 0;
                    local_1038._4_4_ = 0;
                    local_1038._8_4_ = 0;
                    local_1038._12_4_ = 0;
                    local_1038._16_4_ = 0;
                    local_1038._20_4_ = 0;
                    local_1038._24_4_ = 0;
                    local_1038._28_4_ = 0;
                    local_1038._32_4_ = 0;
                    local_1038._36_4_ = 0;
                    local_1038._40_4_ = 0;
                    local_1038._44_4_ = 0;
                    local_1038._48_4_ = 0;
                    local_1038._52_4_ = 0;
                    local_1038._56_4_ = 0;
                    local_1038._60_4_ = 0;
                    local_1038._64_4_ = 0;
                    local_1038._68_4_ = 0;
                    local_1038._72_4_ = 0;
                    local_1038._76_4_ = 0;
                    local_1038._80_4_ = 0;
                    local_1038._84_4_ = 0;
                    local_1038._88_4_ = 0;
                    local_1038._92_4_ = 0;
                    local_1038._96_4_ = 0;
                    local_1038._100_4_ = 0;
                    local_1038._104_5_ = 0;
                    local_1038._109_3_ = 0;
                    local_1038._112_4_ = 0;
                    local_1038[0x74] = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)local_1038,
                               RVar3 * local_ee0 + (1.0 - RVar3) * (double)local_f88);
                    if ((cpp_dec_float<200U,_int,_void> *)local_f68 != local_f78) {
                      pcVar13 = local_f78;
                      pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_f68;
                      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                        (pcVar19->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
                        pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar13 + (ulong)bVar23 * -8 + 4);
                        pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar19 + (ulong)bVar23 * -8 + 4);
                      }
                      local_f68._112_4_ = local_f78->exp;
                      local_f68[0x74] = local_f78->neg;
                      local_ef0 = *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    **)&local_f78->fpclass;
                    }
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              ((cpp_dec_float<200U,_int,_void> *)local_f68,
                               (cpp_dec_float<200U,_int,_void> *)local_1038);
                    pnVar14 = (local_f98->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    puVar15 = (undefined4 *)local_f68;
                    pnVar16 = pnVar14 + iVar6;
                    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                      (pnVar16->m_backend).data._M_elems[0] = *puVar15;
                      puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                      pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
                    }
                    pnVar14[iVar6].m_backend.exp = local_f68._112_4_;
                    pnVar14[iVar6].m_backend.neg = local_f68[0x74];
                    *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      **)&pnVar14[iVar6].m_backend.fpclass = local_ef0;
                    pnVar14 = (local_f98->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + iVar6;
                    local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)0x1c00000000;
                    local_1038._0_4_ = 0;
                    local_1038._4_4_ = 0;
                    local_1038._8_4_ = 0;
                    local_1038._12_4_ = 0;
                    local_1038._16_4_ = 0;
                    local_1038._20_4_ = 0;
                    local_1038._24_4_ = 0;
                    local_1038._28_4_ = 0;
                    local_1038._32_4_ = 0;
                    local_1038._36_4_ = 0;
                    local_1038._40_4_ = 0;
                    local_1038._44_4_ = 0;
                    local_1038._48_4_ = 0;
                    local_1038._52_4_ = 0;
                    local_1038._56_4_ = 0;
                    local_1038._60_4_ = 0;
                    local_1038._64_4_ = 0;
                    local_1038._68_4_ = 0;
                    local_1038._72_4_ = 0;
                    local_1038._76_4_ = 0;
                    local_1038._80_4_ = 0;
                    local_1038._84_4_ = 0;
                    local_1038._88_4_ = 0;
                    local_1038._92_4_ = 0;
                    local_1038._96_4_ = 0;
                    local_1038._100_4_ = 0;
                    local_1038._104_5_ = 0;
                    local_1038._109_3_ = 0;
                    local_1038._112_4_ = 0;
                    local_1038[0x74] = false;
                    if ((pointer)local_1038 != pnVar14) {
                      pnVar16 = pnVar14;
                      puVar15 = (undefined4 *)local_1038;
                      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                        *puVar15 = (pnVar16->m_backend).data._M_elems[0];
                        pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
                        puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                      }
                      local_1038._112_4_ = (pnVar14->m_backend).exp;
                      local_1038[0x74] = (pnVar14->m_backend).neg;
                      local_fc0 = *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    **)&(pnVar14->m_backend).fpclass;
                    }
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              ((cpp_dec_float<200U,_int,_void> *)local_1038,
                               (cpp_dec_float<200U,_int,_void> *)local_eb8);
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              (local_e38,(cpp_dec_float<200U,_int,_void> *)local_1038);
                  }
                }
              }
            }
          }
          else {
            puVar15 = (undefined4 *)local_e28;
            puVar18 = (undefined4 *)local_890;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              *puVar18 = *puVar15;
              puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
              puVar18 = puVar18 + (ulong)bVar23 * -2 + 1;
            }
            local_890._112_4_ = local_e28._112_4_;
            local_890[0x74] = local_e28[0x74];
            local_890._120_8_ = stack0xfffffffffffff250;
            ::soplex::infinity::__tls_init();
            local_c20 = 0x1c00000000;
            local_c98 = 0;
            uStack_c90 = 0;
            local_c88 = 0;
            uStack_c80 = 0;
            local_c78 = 0;
            uStack_c70 = 0;
            local_c68 = 0;
            uStack_c60 = 0;
            local_c58 = 0;
            uStack_c50 = 0;
            local_c48 = 0;
            uStack_c40 = 0;
            local_c38 = 0;
            uStack_c30 = 0;
            uStack_c2b = 0;
            uStack_c28 = 0;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_c98,local_d28);
            lVar9 = 0x1c;
            pcVar13 = &eps->m_backend;
            pnVar10 = &local_510;
            for (; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pnVar10->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar23 * -8 + 4);
              pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar10 + ((ulong)bVar23 * -2 + 1) * 4);
            }
            local_510.m_backend.exp = (eps->m_backend).exp;
            local_510.m_backend.neg = (eps->m_backend).neg;
            local_510.m_backend.fpclass = (eps->m_backend).fpclass;
            local_510.m_backend.prec_elem = (eps->m_backend).prec_elem;
            bVar5 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_890,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_c98,&local_510);
            pUVar22 = local_fa8;
            if (bVar5) {
              puVar12 = (uint *)local_eb8;
              pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_590;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pnVar10->m_backend).data._M_elems[0] = *puVar12;
                puVar12 = puVar12 + (ulong)bVar23 * -2 + 1;
                pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar10 + ((ulong)bVar23 * -2 + 1) * 4);
              }
              local_590._112_4_ = local_eb8._112_4_;
              local_590[0x74] = local_eb8[0x74];
              local_590._120_8_ = local_eb8._120_8_;
              puVar12 = (uint *)local_e28;
              pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_610;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pnVar10->m_backend).data._M_elems[0] = *puVar12;
                puVar12 = puVar12 + (ulong)bVar23 * -2 + 1;
                pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar10 + ((ulong)bVar23 * -2 + 1) * 4);
              }
              local_610._112_4_ = local_e28._112_4_;
              local_610[0x74] = local_e28[0x74];
              local_610._120_8_ = stack0xfffffffffffff250;
              lVar9 = 0x1c;
              pcVar13 = &eps->m_backend;
              pnVar10 = &local_690;
              for (; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pnVar10->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
                pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar23 * -8 + 4)
                ;
                pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar10 + ((ulong)bVar23 * -2 + 1) * 4);
              }
              local_690.m_backend.exp = (eps->m_backend).exp;
              local_690.m_backend.neg = (eps->m_backend).neg;
              local_690.m_backend.fpclass = (eps->m_backend).fpclass;
              local_690.m_backend.prec_elem = (eps->m_backend).prec_elem;
              bVar5 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)local_590,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)local_610,&local_690);
              pUVar22 = local_fa8;
              if (bVar5) {
                local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x1c00000000;
                local_1038._0_4_ = 0;
                local_1038._4_4_ = 0;
                local_1038._8_4_ = 0;
                local_1038._12_4_ = 0;
                local_1038._16_4_ = 0;
                local_1038._20_4_ = 0;
                local_1038._24_4_ = 0;
                local_1038._28_4_ = 0;
                local_1038._32_4_ = 0;
                local_1038._36_4_ = 0;
                local_1038._40_4_ = 0;
                local_1038._44_4_ = 0;
                local_1038._48_4_ = 0;
                local_1038._52_4_ = 0;
                local_1038._56_4_ = 0;
                local_1038._60_4_ = 0;
                local_1038._64_4_ = 0;
                local_1038._68_4_ = 0;
                local_1038._72_4_ = 0;
                local_1038._76_4_ = 0;
                local_1038._80_4_ = 0;
                local_1038._84_4_ = 0;
                local_1038._88_4_ = 0;
                local_1038._92_4_ = 0;
                local_1038._96_4_ = 0;
                local_1038._100_4_ = 0;
                local_1038._104_5_ = 0;
                local_1038._109_3_ = 0;
                local_1038._112_4_ = 0;
                local_1038[0x74] = false;
                if ((cpp_dec_float<200U,_int,_void> *)local_1038 == &eps->m_backend) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_1038,
                             (cpp_dec_float<200U,_int,_void> *)local_e28);
                  if (local_1038._0_4_ != 0 || (fpclass_type)local_fc0 != cpp_dec_float_finite) {
                    local_1038[0x74] = local_1038[0x74] ^ 1;
                  }
                }
                else {
                  puVar15 = (undefined4 *)local_e28;
                  puVar18 = (undefined4 *)local_1038;
                  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                    *puVar18 = *puVar15;
                    puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                    puVar18 = puVar18 + (ulong)bVar23 * -2 + 1;
                  }
                  local_1038._112_4_ = local_e28._112_4_;
                  local_1038[0x74] = local_e28[0x74];
                  local_fc0 = stack0xfffffffffffff250;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_1038,&eps->m_backend);
                }
                pcVar13 = &local_ed8[iVar6].m_backend;
                if (((pcVar13->fpclass != cpp_dec_float_NaN) &&
                    ((fpclass_type)local_fc0 != cpp_dec_float_NaN)) &&
                   (local_f78 = pcVar13,
                   iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     (pcVar13,(cpp_dec_float<200U,_int,_void> *)local_1038),
                   -1 < iVar8)) {
                  local_f88 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                 extract_double(&local_a98);
                  local_ee0 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              extract_double(&local_b18);
                  RVar3 = Random::next_random(local_e30);
                  local_ef0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x1c00000000;
                  local_f68._0_4_ = 0;
                  local_f68._4_4_ = 0;
                  local_f68._8_4_ = 0;
                  local_f68._12_4_ = 0;
                  local_f68._16_4_ = 0;
                  local_f68._20_4_ = 0;
                  local_f68._24_4_ = 0;
                  local_f68._28_4_ = 0;
                  local_f68._32_4_ = 0;
                  local_f68._36_4_ = 0;
                  local_f68._40_4_ = 0;
                  local_f68._44_4_ = 0;
                  local_f68._48_4_ = 0;
                  local_f68._52_4_ = 0;
                  local_f68._56_4_ = 0;
                  local_f68._60_4_ = 0;
                  local_f68._64_4_ = 0;
                  local_f68._68_4_ = 0;
                  local_f68._72_4_ = 0;
                  local_f68._76_4_ = 0;
                  local_f68._80_4_ = 0;
                  local_f68._84_4_ = 0;
                  local_f68._88_4_ = 0;
                  local_f68._92_4_ = 0;
                  local_f68._96_4_ = 0;
                  local_f68._100_4_ = 0;
                  local_f68._104_5_ = 0;
                  local_f68._109_3_ = 0;
                  local_f68._112_4_ = 0;
                  local_f68[0x74] = false;
                  local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x1c00000000;
                  local_1038._0_4_ = 0;
                  local_1038._4_4_ = 0;
                  local_1038._8_4_ = 0;
                  local_1038._12_4_ = 0;
                  local_1038._16_4_ = 0;
                  local_1038._20_4_ = 0;
                  local_1038._24_4_ = 0;
                  local_1038._28_4_ = 0;
                  local_1038._32_4_ = 0;
                  local_1038._36_4_ = 0;
                  local_1038._40_4_ = 0;
                  local_1038._44_4_ = 0;
                  local_1038._48_4_ = 0;
                  local_1038._52_4_ = 0;
                  local_1038._56_4_ = 0;
                  local_1038._60_4_ = 0;
                  local_1038._64_4_ = 0;
                  local_1038._68_4_ = 0;
                  local_1038._72_4_ = 0;
                  local_1038._76_4_ = 0;
                  local_1038._80_4_ = 0;
                  local_1038._84_4_ = 0;
                  local_1038._88_4_ = 0;
                  local_1038._92_4_ = 0;
                  local_1038._96_4_ = 0;
                  local_1038._100_4_ = 0;
                  local_1038._104_5_ = 0;
                  local_1038._109_3_ = 0;
                  local_1038._112_4_ = 0;
                  local_1038[0x74] = false;
                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                            ((cpp_dec_float<200u,int,void> *)local_1038,
                             RVar3 * local_ee0 + (1.0 - RVar3) * (double)local_f88);
                  if ((cpp_dec_float<200U,_int,_void> *)local_f68 != local_f78) {
                    pcVar13 = local_f78;
                    pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_f68;
                    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                      (pcVar19->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
                      pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar13 + (ulong)bVar23 * -8 + 4);
                      pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar19 + (ulong)bVar23 * -8 + 4);
                    }
                    local_f68._112_4_ = local_f78->exp;
                    local_f68[0x74] = local_f78->neg;
                    local_ef0 = *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  **)&local_f78->fpclass;
                  }
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                            ((cpp_dec_float<200U,_int,_void> *)local_f68,
                             (cpp_dec_float<200U,_int,_void> *)local_1038);
                  pnVar14 = (local_f90->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  puVar15 = (undefined4 *)local_f68;
                  pnVar16 = pnVar14 + iVar6;
                  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                    (pnVar16->m_backend).data._M_elems[0] = *puVar15;
                    puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                    pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
                  }
                  pnVar14[iVar6].m_backend.exp = local_f68._112_4_;
                  pnVar14[iVar6].m_backend.neg = local_f68[0x74];
                  *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    **)&pnVar14[iVar6].m_backend.fpclass = local_ef0;
                  pnVar14 = (local_f90->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + iVar6;
                  local_fc0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x1c00000000;
                  local_1038._0_4_ = 0;
                  local_1038._4_4_ = 0;
                  local_1038._8_4_ = 0;
                  local_1038._12_4_ = 0;
                  local_1038._16_4_ = 0;
                  local_1038._20_4_ = 0;
                  local_1038._24_4_ = 0;
                  local_1038._28_4_ = 0;
                  local_1038._32_4_ = 0;
                  local_1038._36_4_ = 0;
                  local_1038._40_4_ = 0;
                  local_1038._44_4_ = 0;
                  local_1038._48_4_ = 0;
                  local_1038._52_4_ = 0;
                  local_1038._56_4_ = 0;
                  local_1038._60_4_ = 0;
                  local_1038._64_4_ = 0;
                  local_1038._68_4_ = 0;
                  local_1038._72_4_ = 0;
                  local_1038._76_4_ = 0;
                  local_1038._80_4_ = 0;
                  local_1038._84_4_ = 0;
                  local_1038._88_4_ = 0;
                  local_1038._92_4_ = 0;
                  local_1038._96_4_ = 0;
                  local_1038._100_4_ = 0;
                  local_1038._104_5_ = 0;
                  local_1038._109_3_ = 0;
                  local_1038._112_4_ = 0;
                  local_1038[0x74] = false;
                  if ((pointer)local_1038 != pnVar14) {
                    pnVar16 = pnVar14;
                    puVar15 = (undefined4 *)local_1038;
                    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                      *puVar15 = (pnVar16->m_backend).data._M_elems[0];
                      pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
                      puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
                    }
                    local_1038._112_4_ = (pnVar14->m_backend).exp;
                    local_1038[0x74] = (pnVar14->m_backend).neg;
                    local_fc0 = *(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  **)&(pnVar14->m_backend).fpclass;
                  }
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_1038,
                             (cpp_dec_float<200U,_int,_void> *)local_e28);
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                            (local_e38,(cpp_dec_float<200U,_int,_void> *)local_1038);
                }
              }
            }
          }
        }
        uVar20 = uVar20 - incr;
      } while (-1 < (int)uVar20);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::perturbMax(
   const UpdateVector<R>& uvec,
   VectorBase<R>& p_low,
   VectorBase<R>& p_up,
   R eps,
   R p_delta,
   int start,
   int incr)
{
   assert(uvec.dim() == p_low.dim());
   assert(uvec.dim() == p_up.dim());

   const R* vec = uvec.get_const_ptr();
   R minrandom = 10.0 * p_delta;
   R maxrandom = 100.0 * p_delta;
   R x, l, u;
   int i;

   if(fullPerturbation)
   {
      eps = p_delta;

      for(i = uvec.dim() - start - 1; i >= 0; i -= incr)
      {
         u = p_up[i];
         l = p_low[i];
         x = vec[i];

         if(LT(u, R(infinity), eps) && NE(l, u, eps) && u <= x + eps)
         {
            p_up[i] = x + random.next((double)minrandom, (double)maxrandom);
            theShift += p_up[i] - u;
         }

         if(GT(l, R(-infinity), eps) && NE(l, u, eps) && l >= x - eps)
         {
            p_low[i] = x - random.next((double)minrandom, (double)maxrandom);
            theShift -= p_low[i] - l;
         }
      }
   }
   else
   {
      const R* upd = uvec.delta().values();
      const IdxSet& idx = uvec.delta().indices();

      for(int j = uvec.delta().size() - start - 1; j >= 0; j -= incr)
      {
         i = idx.index(j);
         x = upd[i];
         u = p_up[i];
         l = p_low[i];

         // do not permute these bounds! c.f. computeFrhs2() in spxvecs.cpp
         if(this->dualStatus(this->baseId(i)) == SPxBasisBase<R>::Desc::D_ON_BOTH)
         {
            continue;
         }

         if(x > eps)
         {
            if(LT(u, R(infinity), eps) && NE(l, u, eps) && vec[i] >= u - eps)
            {
               p_up[i] = vec[i] + random.next((double)minrandom, (double)maxrandom);
               theShift += p_up[i] - u;
            }
         }
         else if(x < -eps)
         {
            if(GT(l, R(-infinity), eps) && NE(l, u, eps) && vec[i] <= l + eps)
            {
               p_low[i] = vec[i] - random.next((double)minrandom, (double)maxrandom);
               theShift -= p_low[i] - l;
            }
         }
      }
   }
}